

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O2

void gen_start(void *args0)

{
  Generator *pGVar1;
  
  pGVar1 = active_context.gen;
  if (active_context.gen == (Generator *)0x0) {
    fprintf(_stderr,"requirement not met: %s\n","gen");
    abort();
  }
  fprintf((FILE *)out,"[Generator[%d] %s] STARTING\n",(ulong)(uint)(active_context.gen)->id,
          (active_context.gen)->name);
  (**args0)(*(undefined8 *)((long)args0 + 8));
  pGVar1->done = true;
  fprintf((FILE *)out,"[Generator[%d] %s] FINISH\n",(ulong)(uint)pGVar1->id,pGVar1->name);
  free(*(void **)((long)args0 + 8));
  fiber_switch(active_context.fiber,active_context.caller);
  abort();
}

Assistant:

static void
gen_start(void *args0)
{
    GeneratorArgs *args = (GeneratorArgs *) args0;
    Generator *gen = active_context.gen;
    require(gen);
    fprintf(out, "[Generator[%d] %s] STARTING\n", gen->id, gen->name);
    args->entry(args->args);
    gen->done = true;
    fprintf(out, "[Generator[%d] %s] FINISH\n", gen->id, gen->name);
    free(args->args);
    fiber_switch(active_context.fiber, active_context.caller);
    // noreturn
    abort();
}